

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int run_bitset_container_intersection_cardinality(run_container_t *src_1,bitset_container_t *src_2)

{
  ushort uVar1;
  uint uVar2;
  rle16_t *prVar3;
  uint64_t *puVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  
  uVar2 = src_1->n_runs;
  prVar3 = src_1->runs;
  if (((ulong)uVar2 == 1) && (prVar3->value == 0)) {
    if (prVar3->length == 0xffff) {
      return src_2->cardinality;
    }
  }
  else if ((int)uVar2 < 1) {
    return 0;
  }
  puVar4 = src_2->words;
  uVar13 = 0;
  iVar5 = 0;
  do {
    uVar1 = prVar3[uVar13].value;
    uVar7 = (uint)prVar3[uVar13].length + (uint)uVar1;
    uVar14 = (uint)(uVar1 >> 6);
    uVar9 = uVar7 >> 6;
    bVar6 = (byte)uVar1;
    if (uVar14 == uVar9) {
      uVar8 = (0xffffffffffffffffU >> (0x3fU - (char)prVar3[uVar13].length & 0x3f)) <<
              (bVar6 & 0x3f) & puVar4[uVar14];
      uVar8 = uVar8 - (uVar8 >> 1 & 0x5555555555555555);
      uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
      uVar10 = (uint)(byte)(((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
    }
    else {
      uVar8 = (puVar4[uVar14] >> (bVar6 & 0x3f)) << (bVar6 & 0x3f);
      uVar8 = uVar8 - (uVar8 >> 1 & 0x5555555555555555);
      uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
      uVar8 = ((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
      uVar11 = uVar8 >> 0x38;
      uVar10 = (uint)(byte)(uVar8 >> 0x38);
      if (uVar14 + 1 < uVar9) {
        uVar8 = (ulong)(uVar14 + 1);
        do {
          uVar12 = puVar4[uVar8] - (puVar4[uVar8] >> 1 & 0x5555555555555555);
          uVar12 = (uVar12 >> 2 & 0x3333333333333333) + (uVar12 & 0x3333333333333333);
          uVar10 = (int)uVar11 +
                   (uint)(byte)(((uVar12 >> 4) + uVar12 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                               0x38);
          uVar11 = (ulong)uVar10;
          uVar8 = uVar8 + 1;
        } while (uVar9 != uVar8);
      }
      bVar6 = ~(byte)uVar7;
      uVar8 = (puVar4[uVar9] << (bVar6 & 0x3f)) >> (bVar6 & 0x3f);
      uVar8 = uVar8 - (uVar8 >> 1 & 0x5555555555555555);
      uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
      uVar10 = (byte)(((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38) +
               uVar10;
    }
    iVar5 = iVar5 + uVar10;
    uVar13 = uVar13 + 1;
  } while (uVar13 != uVar2);
  return iVar5;
}

Assistant:

int run_bitset_container_intersection_cardinality(
    const run_container_t *src_1, const bitset_container_t *src_2) {
    if (run_container_is_full(src_1)) {
        return bitset_container_cardinality(src_2);
    }
    int answer = 0;
    for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
        rle16_t rle = src_1->runs[rlepos];
        answer +=
            bitset_lenrange_cardinality(src_2->words, rle.value, rle.length);
    }
    return answer;
}